

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O3

tuple<int,_float> __thiscall
testinator::Arbitrary<std::tuple<int,_float>_>::generate
          (Arbitrary<std::tuple<int,_float>_> *this,size_t n,unsigned_long randomSeed)

{
  int iVar1;
  TestRegistry *pTVar2;
  result_type randomSeed_00;
  long lVar3;
  ulong uVar4;
  uniform_int_distribution<unsigned_long> dis;
  param_type local_38;
  
  pTVar2 = TestRegistry::Instance();
  uVar4 = randomSeed & 0xffffffff;
  (pTVar2->m_generator)._M_x[0] = uVar4;
  lVar3 = 0x19;
  do {
    uVar4 = (ulong)((((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar3) - 0x18);
    *(ulong *)(&(pTVar2->m_tests)._M_t._M_impl.field_0x0 + lVar3 * 8) = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x288);
  (pTVar2->m_generator)._M_p = 0x270;
  local_38._M_a = 0;
  local_38._M_b = 0xffffffffffffffff;
  randomSeed_00 =
       ::std::uniform_int_distribution<unsigned_long>::operator()
                 ((uniform_int_distribution<unsigned_long> *)&local_38,&pTVar2->m_generator,
                  &local_38);
  iVar1 = detail::Arbitrary_Arithmetic<int>::generate(n,randomSeed);
  Arbitrary<std::tuple<float>_>::generate((Arbitrary<std::tuple<float>_> *)this,n,randomSeed_00);
  *(int *)(this + 4) = iVar1;
  return (tuple<int,_float>)(_Tuple_impl<0UL,_int,_float>)this;
}

Assistant:

static std::tuple<Ts...> generate(std::size_t n, unsigned long int randomSeed)
    {
      auto r1 = randomSeed;
      auto r2 = nextRandom(r1);

      using H = std::tuple_element_t<0, std::tuple<Ts...>>;
      using T = decltype(tuple_tail(std::declval<std::tuple<Ts...>>()));
      return tuple_cons(Arbitrary<H>::generate(n, r1),
                        Arbitrary<T>::generate(n, r2));
    }